

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rename.c
# Opt level: O3

int rename(char *__old,char *__new)

{
  int iVar1;
  _PDCLIB_file_t *p_Var2;
  
  mtx_lock(&_PDCLIB_filelist_mtx);
  p_Var2 = _PDCLIB_filelist;
  do {
    if (p_Var2 == (_PDCLIB_file_t *)0x0) {
      mtx_unlock(&_PDCLIB_filelist_mtx);
      iVar1 = _PDCLIB_rename(__old,__new);
      return iVar1;
    }
    if (p_Var2->filename != (char *)0x0) {
      iVar1 = strcmp(p_Var2->filename,__old);
      if (iVar1 == 0) {
        mtx_unlock(&_PDCLIB_filelist_mtx);
        return -1;
      }
    }
    p_Var2 = p_Var2->next;
  } while( true );
}

Assistant:

int rename( const char * oldpath, const char * newpath )
{
    _PDCLIB_LOCK( _PDCLIB_filelist_mtx );

    {
        struct _PDCLIB_file_t * current = _PDCLIB_filelist;

        while ( current != NULL )
        {
            if ( ( current->filename != NULL ) && ( strcmp( current->filename, oldpath ) == 0 ) )
            {
                /* File of that name currently open. Do not rename. */
                _PDCLIB_UNLOCK( _PDCLIB_filelist_mtx );
                return EOF;
            }

            current = current->next;
        }
    }

    _PDCLIB_UNLOCK( _PDCLIB_filelist_mtx );
    return _PDCLIB_rename( oldpath, newpath );
}